

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
::val(FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>_>
      *this)

{
  double dVar1;
  value_type_conflict1 *pvVar2;
  FadCst<double> *in_RDI;
  value_type vVar3;
  
  pvVar2 = FadCst<double>::val(in_RDI);
  dVar1 = *pvVar2;
  vVar3 = FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadFuncExp<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncCos<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>_>_>
                 *)0x1f19a51);
  return dVar1 - vVar3;
}

Assistant:

const value_type val() const {return left_.val() - right_.val();}